

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
::find_position<A>(dense_hashtable<A,_A,_HashA,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::Identity,_google::dense_hash_set<A,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<A>_>
                   *this,A *key)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  
  uVar4 = this->num_buckets - 1;
  uVar3 = uVar4 & (long)key->_i;
  iVar1 = (this->key_info).empty_key._i;
  iVar6 = this->table[uVar3]._i;
  uVar2 = 0xffffffffffffffff;
  if (iVar1 == iVar6) {
    uVar7 = 0xffffffffffffffff;
  }
  else {
    uVar7 = 0xffffffffffffffff;
    lVar5 = 1;
    do {
      if ((this->num_deleted == 0) || ((this->key_info).delkey._i != iVar6)) {
        if (key->_i == iVar6) {
          uVar2 = uVar3;
          uVar3 = 0xffffffffffffffff;
          goto LAB_00a5fab8;
        }
      }
      else if (uVar7 == 0xffffffffffffffff) {
        uVar7 = uVar3;
      }
      uVar3 = uVar3 + lVar5 & uVar4;
      iVar6 = this->table[uVar3]._i;
      lVar5 = lVar5 + 1;
    } while (iVar1 != iVar6);
  }
  if (uVar7 != 0xffffffffffffffff) {
    uVar3 = uVar7;
  }
LAB_00a5fab8:
  pVar8.second = uVar3;
  pVar8.first = uVar2;
  return pVar8;
}

Assistant:

size_type bucket_count() const { return num_buckets; }